

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

size_t SaveMultiChannelEXRToMemory(EXRImage *exrImage,uchar **memory_out,char **err)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first_01;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first_02;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first_03;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first_04;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first_05;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first_06;
  value_type vVar1;
  bool bVar2;
  reference pvVar3;
  int *piVar4;
  size_type sVar5;
  reference pvVar6;
  uint *puVar7;
  reference pvVar8;
  unsigned_long_long *val_00;
  reference this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar9;
  void *pvVar10;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  *this_00;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int i_2;
  uint dataLen_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> header_3;
  uint outSize_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_1;
  uint bufLen;
  uint dataLen_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> header_2;
  unsigned_long_long outSize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  uint dataLen;
  vector<unsigned_char,_std::allocator<unsigned_char>_> header_1;
  uint *linePtr_4;
  uint val_2;
  int x_4;
  int y_4;
  float *linePtr_3;
  float val_1;
  int x_3;
  int y_3;
  unsigned_short *linePtr_2;
  FP16 h16_1;
  FP32 f32_1;
  int x_2;
  int y_2;
  unsigned_short *linePtr_1;
  unsigned_short val;
  int x_1;
  int y_1;
  float *linePtr;
  FP32 f32;
  FP16 h16;
  int x;
  int y;
  int c_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  int h;
  int endY;
  int startY;
  int i_1;
  int c_1;
  size_t channelOffset;
  int pixelDataSize;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channelOffsetList;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  dataList;
  bool isBigEndian;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  longlong offset;
  size_t headerSize;
  vector<long_long,_std::allocator<long_long>_> offsets;
  int numBlocks;
  uchar e;
  int i;
  float w;
  float center [2];
  float aspectRatio;
  uchar lineOrder;
  int data_2 [4];
  int comp;
  ChannelInfo info;
  int c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_1;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  int numScanlines;
  char marker [4];
  char header [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> memory;
  int in_stack_00021964;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  *in_stack_00021968;
  size_t in_stack_00021970;
  uchar *in_stack_00021978;
  uint *in_stack_00021980;
  uchar *in_stack_00021988;
  int in_stack_000219a0;
  int in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff80c;
  vector<long_long,_std::allocator<long_long>_> *in_stack_fffffffffffff810;
  value_type *in_stack_fffffffffffff818;
  allocator_type *in_stack_fffffffffffff820;
  size_type in_stack_fffffffffffff828;
  vector<long_long,_std::allocator<long_long>_> *in_stack_fffffffffffff830;
  allocator<char> *in_stack_fffffffffffff840;
  char *in_stack_fffffffffffff848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff850;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffff858;
  undefined7 in_stack_fffffffffffff860;
  undefined1 in_stack_fffffffffffff867;
  const_iterator in_stack_fffffffffffff868;
  undefined8 in_stack_fffffffffffff8b0;
  iterator in_stack_fffffffffffff8b8;
  uint *in_stack_fffffffffffff8c0;
  unsigned_long_long *in_stack_fffffffffffff8c8;
  undefined7 in_stack_fffffffffffff8d0;
  undefined1 in_stack_fffffffffffff8d7;
  int local_46c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3e8;
  undefined4 local_3cc;
  uchar *local_3c8;
  uchar *local_3c0;
  uchar *local_3b8;
  uchar *local_3b0;
  uchar *local_3a8;
  uchar *local_398;
  uchar *local_390;
  uchar *local_388;
  uchar *local_380;
  undefined4 local_370;
  size_type local_350;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_340;
  uchar *local_328;
  uchar *local_320;
  uchar *local_318;
  uchar *local_310;
  uchar *local_308;
  uchar *local_2f8;
  uchar *local_2f0;
  uchar *local_2e8;
  uchar *local_2e0;
  undefined4 local_2d0;
  reference local_2b0;
  uint local_2a4;
  int local_2a0;
  int local_29c;
  reference local_298;
  uint local_28c;
  int local_288;
  int local_284;
  reference local_280;
  FP32 local_278;
  FP16 local_274;
  FP16 local_270;
  FP32 local_26c;
  int local_268;
  int local_264;
  reference local_260;
  unsigned_short local_252;
  int local_250;
  int local_24c;
  reference local_248;
  FP16 local_23c;
  FP32 local_238;
  FP16 local_234;
  int local_230;
  int local_22c;
  int local_228;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_220;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  value_type local_1f0;
  int local_1e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1e0;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1c0;
  byte local_1a1;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  *local_188;
  size_type local_180;
  vector<long_long,_std::allocator<long_long>_> local_170;
  int local_158;
  undefined1 local_151;
  int local_150;
  float local_14c;
  uint local_148 [3];
  undefined1 local_139;
  uint local_138 [3];
  uint local_12c [3];
  uint local_120;
  allocator<char> local_119;
  string local_118 [32];
  string local_f8 [32];
  undefined4 local_d8;
  undefined1 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  int local_c4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c0 [2];
  int local_8c;
  uchar *local_88;
  uchar *local_80;
  undefined4 local_6c;
  uchar *local_68;
  uchar *local_50;
  undefined4 local_3c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  undefined8 *local_18;
  long local_10;
  size_type local_8;
  
  if ((((in_RDI == 0) || (in_RSI == (undefined8 *)0x0)) || (*(int *)(in_RDI + 0x1034) < 0)) ||
     (4 < *(int *)(in_RDI + 0x1034))) {
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = "Invalid argument.";
    }
    local_8 = 0;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12cb2a);
    local_3c = 0x1312f76;
    local_50 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffff810,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    local_68 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                        insert<char_const*,void>
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   in_stack_fffffffffffff850,in_stack_fffffffffffff858._M_current,
                                   in_stack_fffffffffffff848,(char *)in_stack_fffffffffffff840);
    local_6c = 2;
    local_80 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffff810,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    local_88 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                        insert<char_const*,void>
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   in_stack_fffffffffffff850,in_stack_fffffffffffff858._M_current,
                                   in_stack_fffffffffffff848,(char *)in_stack_fffffffffffff840);
    local_8c = 1;
    if (*(int *)(local_10 + 0x1034) == 3) {
      local_8c = 0x10;
    }
    else if (*(int *)(local_10 + 0x1034) == 4) {
      local_8c = 0x20;
    }
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::vector((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
              *)0x12cc87);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12cc94);
    for (local_c4 = 0; local_c4 < *(int *)(local_10 + 0x1004); local_c4 = local_c4 + 1) {
      anon_unknown.dwarf_1537e::anon_struct_48_5_91bcb76e::ChannelInfo
                ((anon_struct_48_5_91bcb76e *)0x12ccc7);
      local_d4 = 0;
      local_d8 = *(undefined4 *)(*(long *)(local_10 + 0x1020) + (long)local_c4 * 4);
      local_d0 = 1;
      local_cc = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
      std::__cxx11::string::operator=(local_f8,local_118);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator(&local_119);
      std::
      vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ::push_back((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                   *)in_stack_fffffffffffff820,in_stack_fffffffffffff818);
      anon_unknown.dwarf_1537e::anon_struct_48_5_91bcb76e::~ChannelInfo
                ((anon_struct_48_5_91bcb76e *)0x12cdc0);
    }
    anon_unknown.dwarf_1537e::WriteChannelInfo
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff867,in_stack_fffffffffffff860),
               (vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                *)in_stack_fffffffffffff858._M_current);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff810,
               CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_c0);
    anon_unknown.dwarf_1537e::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
               (char *)in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               in_stack_fffffffffffff8b8._M_current,(int)((ulong)in_stack_fffffffffffff8b0 >> 0x20))
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff820);
    local_120 = *(uint *)(local_10 + 0x1034);
    bVar2 = anon_unknown.dwarf_1537e::IsBigEndian();
    if (bVar2) {
      anon_unknown.dwarf_1537e::swap4(&local_120);
    }
    anon_unknown.dwarf_1537e::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
               (char *)in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               in_stack_fffffffffffff8b8._M_current,(int)((ulong)in_stack_fffffffffffff8b0 >> 0x20))
    ;
    local_138[0] = 0;
    local_138[1] = 0;
    local_138[2] = *(int *)(local_10 + 0x1028) + -1;
    local_12c[0] = *(int *)(local_10 + 0x102c) - 1;
    bVar2 = anon_unknown.dwarf_1537e::IsBigEndian();
    if (bVar2) {
      anon_unknown.dwarf_1537e::swap4(local_138);
      anon_unknown.dwarf_1537e::swap4(local_138 + 1);
      anon_unknown.dwarf_1537e::swap4(local_138 + 2);
      anon_unknown.dwarf_1537e::swap4(local_12c);
    }
    anon_unknown.dwarf_1537e::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
               (char *)in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               in_stack_fffffffffffff8b8._M_current,(int)((ulong)in_stack_fffffffffffff8b0 >> 0x20))
    ;
    anon_unknown.dwarf_1537e::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
               (char *)in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               in_stack_fffffffffffff8b8._M_current,(int)((ulong)in_stack_fffffffffffff8b0 >> 0x20))
    ;
    local_139 = 0;
    anon_unknown.dwarf_1537e::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
               (char *)in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               in_stack_fffffffffffff8b8._M_current,(int)((ulong)in_stack_fffffffffffff8b0 >> 0x20))
    ;
    local_148[2] = 0x3f800000;
    bVar2 = anon_unknown.dwarf_1537e::IsBigEndian();
    if (bVar2) {
      anon_unknown.dwarf_1537e::swap4(local_148 + 2);
    }
    anon_unknown.dwarf_1537e::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
               (char *)in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               in_stack_fffffffffffff8b8._M_current,(int)((ulong)in_stack_fffffffffffff8b0 >> 0x20))
    ;
    local_148[0] = 0;
    local_148[1] = 0;
    bVar2 = anon_unknown.dwarf_1537e::IsBigEndian();
    if (bVar2) {
      anon_unknown.dwarf_1537e::swap4(local_148);
      anon_unknown.dwarf_1537e::swap4(local_148 + 1);
    }
    anon_unknown.dwarf_1537e::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
               (char *)in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               in_stack_fffffffffffff8b8._M_current,(int)((ulong)in_stack_fffffffffffff8b0 >> 0x20))
    ;
    local_14c = (float)*(int *)(local_10 + 0x1028);
    bVar2 = anon_unknown.dwarf_1537e::IsBigEndian();
    if (bVar2) {
      anon_unknown.dwarf_1537e::swap4((uint *)&local_14c);
    }
    anon_unknown.dwarf_1537e::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
               (char *)in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
               in_stack_fffffffffffff8b8._M_current,(int)((ulong)in_stack_fffffffffffff8b0 >> 0x20))
    ;
    if (0 < *(int *)(local_10 + 0x1000)) {
      for (local_150 = 0; local_150 < *(int *)(local_10 + 0x1000); local_150 = local_150 + 1) {
        anon_unknown.dwarf_1537e::WriteAttributeToMemory
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
                   (char *)in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
                   in_stack_fffffffffffff8b8._M_current,
                   (int)((ulong)in_stack_fffffffffffff8b0 >> 0x20));
      }
    }
    local_151 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff820,
               (value_type_conflict1 *)in_stack_fffffffffffff818);
    local_158 = *(int *)(local_10 + 0x102c) / local_8c;
    if (local_158 * local_8c < *(int *)(local_10 + 0x102c)) {
      local_158 = local_158 + 1;
    }
    std::allocator<long_long>::allocator((allocator<long_long> *)0x12d2b1);
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (in_stack_fffffffffffff830,in_stack_fffffffffffff828,
               (allocator_type *)in_stack_fffffffffffff820);
    std::allocator<long_long>::~allocator((allocator<long_long> *)0x12d2dd);
    local_180 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_38);
    local_188 = (vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                 *)(local_180 + (long)local_158 * 8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12d31b);
    local_1a1 = anon_unknown.dwarf_1537e::IsBigEndian();
    std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::allocator
              ((allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)0x12d35e);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)in_stack_fffffffffffff830,in_stack_fffffffffffff828,
             (allocator_type *)in_stack_fffffffffffff820);
    std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~allocator
              ((allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)0x12d38a);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x12d3b6);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff830,
               in_stack_fffffffffffff828,in_stack_fffffffffffff820);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x12d3e2);
    local_1e8 = 0;
    local_1f0 = 0;
    for (local_1f4 = 0; vVar1 = local_1f0, local_1f4 < *(int *)(local_10 + 0x1004);
        local_1f4 = local_1f4 + 1) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_1e0,(long)local_1f4);
      *pvVar3 = vVar1;
      if (*(int *)(*(long *)(local_10 + 0x1020) + (long)local_1f4 * 4) == 1) {
        local_1e8 = local_1e8 + 2;
        local_1f0 = local_1f0 + 2;
      }
      else if (*(int *)(*(long *)(local_10 + 0x1020) + (long)local_1f4 * 4) == 2) {
        local_1e8 = local_1e8 + 4;
        local_1f0 = local_1f0 + 4;
      }
      else if (*(int *)(*(long *)(local_10 + 0x1020) + (long)local_1f4 * 4) == 0) {
        local_1e8 = local_1e8 + 4;
        local_1f0 = local_1f0 + 4;
      }
    }
    for (local_1f8 = 0; local_1f8 < local_158; local_1f8 = local_1f8 + 1) {
      local_1fc = local_8c * local_1f8;
      local_204 = local_8c * (local_1f8 + 1);
      piVar4 = std::min<int>(&local_204,(int *)(local_10 + 0x102c));
      local_200 = *piVar4;
      local_208 = local_200 - local_1fc;
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x12d6b1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff830,
                 in_stack_fffffffffffff828,(allocator_type *)in_stack_fffffffffffff820);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x12d6dd);
      for (local_228 = 0; local_228 < *(int *)(local_10 + 0x1004); local_228 = local_228 + 1) {
        if (*(int *)(*(long *)(local_10 + 0x1018) + (long)local_228 * 4) == 1) {
          if (*(int *)(*(long *)(local_10 + 0x1020) + (long)local_228 * 4) == 2) {
            for (local_22c = 0; local_22c < local_208; local_22c = local_22c + 1) {
              for (local_230 = 0; local_230 < *(int *)(local_10 + 0x1028); local_230 = local_230 + 1
                  ) {
                local_234.u = *(undefined2 *)
                               (*(long *)(*(long *)(local_10 + 0x1010) + (long)local_228 * 8) +
                               (long)((local_22c + local_1fc) * *(int *)(local_10 + 0x1028) +
                                     local_230) * 2);
                local_23c = local_234;
                local_238 = anon_unknown.dwarf_1537e::half_to_float(local_234);
                if ((local_1a1 & 1) != 0) {
                  anon_unknown.dwarf_1537e::swap4(&local_238.u);
                }
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&local_1e0,(long)local_228);
                local_248 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       in_stack_fffffffffffff810,
                                       CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808)
                                      );
                *(FP32 *)(local_248 + (long)local_230 * 4) = local_238;
              }
            }
          }
          else if (*(int *)(*(long *)(local_10 + 0x1020) + (long)local_228 * 4) == 1) {
            for (local_24c = 0; local_24c < local_208; local_24c = local_24c + 1) {
              for (local_250 = 0; local_250 < *(int *)(local_10 + 0x1028); local_250 = local_250 + 1
                  ) {
                local_252 = *(unsigned_short *)
                             (*(long *)(*(long *)(local_10 + 0x1010) + (long)local_228 * 8) +
                             (long)((local_24c + local_1fc) * *(int *)(local_10 + 0x1028) +
                                   local_250) * 2);
                if ((local_1a1 & 1) != 0) {
                  anon_unknown.dwarf_1537e::swap2(&local_252);
                }
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&local_1e0,(long)local_228);
                local_260 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       in_stack_fffffffffffff810,
                                       CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808)
                                      );
                *(unsigned_short *)(local_260 + (long)local_250 * 2) = local_252;
              }
            }
          }
        }
        else if (*(int *)(*(long *)(local_10 + 0x1018) + (long)local_228 * 4) == 2) {
          if (*(int *)(*(long *)(local_10 + 0x1020) + (long)local_228 * 4) == 1) {
            for (local_264 = 0; local_264 < local_208; local_264 = local_264 + 1) {
              for (local_268 = 0; local_268 < *(int *)(local_10 + 0x1028); local_268 = local_268 + 1
                  ) {
                local_278 = *(FP32 *)(*(long *)(*(long *)(local_10 + 0x1010) + (long)local_228 * 8)
                                     + (long)((local_264 + local_1fc) * *(int *)(local_10 + 0x1028)
                                             + local_268) * 4);
                local_26c = local_278;
                local_274 = anon_unknown.dwarf_1537e::float_to_half_full(local_278);
                local_270 = local_274;
                if ((local_1a1 & 1) != 0) {
                  anon_unknown.dwarf_1537e::swap2(&local_270.u);
                }
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&local_1e0,(long)local_228);
                local_280 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       in_stack_fffffffffffff810,
                                       CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808)
                                      );
                *(unsigned_short *)(local_280 + (long)local_268 * 2) = local_270.u;
              }
            }
          }
          else if (*(int *)(*(long *)(local_10 + 0x1020) + (long)local_228 * 4) == 2) {
            for (local_284 = 0; local_284 < local_208; local_284 = local_284 + 1) {
              for (local_288 = 0; local_288 < *(int *)(local_10 + 0x1028); local_288 = local_288 + 1
                  ) {
                local_28c = *(uint *)(*(long *)(*(long *)(local_10 + 0x1010) + (long)local_228 * 8)
                                     + (long)((local_284 + local_1fc) * *(int *)(local_10 + 0x1028)
                                             + local_288) * 4);
                if ((local_1a1 & 1) != 0) {
                  anon_unknown.dwarf_1537e::swap4(&local_28c);
                }
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&local_1e0,(long)local_228);
                local_298 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       in_stack_fffffffffffff810,
                                       CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808)
                                      );
                *(uint *)(local_298 + (long)local_288 * 4) = local_28c;
              }
            }
          }
        }
        else if (*(int *)(*(long *)(local_10 + 0x1018) + (long)local_228 * 4) == 0) {
          for (local_29c = 0; local_29c < local_208; local_29c = local_29c + 1) {
            for (local_2a0 = 0; local_2a0 < *(int *)(local_10 + 0x1028); local_2a0 = local_2a0 + 1)
            {
              local_2a4 = *(uint *)(*(long *)(*(long *)(local_10 + 0x1010) + (long)local_228 * 8) +
                                   (long)((local_29c + local_1fc) * *(int *)(local_10 + 0x1028) +
                                         local_2a0) * 4);
              if ((local_1a1 & 1) != 0) {
                anon_unknown.dwarf_1537e::swap4(&local_2a4);
              }
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (&local_1e0,(long)local_228);
              local_2b0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     in_stack_fffffffffffff810,
                                     CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
              *(uint *)(local_2b0 + (long)local_2a0 * 4) = local_2a4;
            }
          }
        }
      }
      if (*(int *)(local_10 + 0x1034) == 0) {
        std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x12e09f);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff830,in_stack_fffffffffffff828,
                   (allocator_type *)in_stack_fffffffffffff820);
        std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x12e0c8);
        sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_220);
        local_2d0 = (undefined4)sVar5;
        piVar4 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   in_stack_fffffffffffff810,
                                   CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        *piVar4 = local_1fc;
        pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            in_stack_fffffffffffff810,
                            CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        *(undefined4 *)pvVar6 = local_2d0;
        bVar2 = anon_unknown.dwarf_1537e::IsBigEndian();
        if (bVar2) {
          puVar7 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      in_stack_fffffffffffff810,
                                      CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808))
          ;
          anon_unknown.dwarf_1537e::swap4(puVar7);
          puVar7 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      in_stack_fffffffffffff810,
                                      CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808))
          ;
          anon_unknown.dwarf_1537e::swap4(puVar7);
        }
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](&local_1c0,(long)local_1f8);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](&local_1c0,(long)local_1f8);
        local_2e0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808
                                                ));
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffff810,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        local_2e8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808
                                                ));
        local_2f0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808
                                                ));
        __first._M_current._7_1_ = in_stack_fffffffffffff867;
        __first._M_current._0_7_ = in_stack_fffffffffffff860;
        local_2f8 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                             insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        in_stack_fffffffffffff850,in_stack_fffffffffffff868,__first,
                                        in_stack_fffffffffffff858);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](&local_1c0,(long)local_1f8);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](&local_1c0,(long)local_1f8);
        local_308 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808
                                                ));
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffff810,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        local_310 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808
                                                ));
        local_320 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808
                                                ));
        local_318 = (uchar *)__gnu_cxx::
                             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                          *)in_stack_fffffffffffff818,
                                         (difference_type)in_stack_fffffffffffff810);
        __first_00._M_current._7_1_ = in_stack_fffffffffffff867;
        __first_00._M_current._0_7_ = in_stack_fffffffffffff860;
        local_328 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                             insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        in_stack_fffffffffffff850,in_stack_fffffffffffff868,
                                        __first_00,in_stack_fffffffffffff858);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff820);
      }
      else if ((*(int *)(local_10 + 0x1034) == 2) || (*(int *)(local_10 + 0x1034) == 3)) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_220);
        mz_compressBound(0x12e401);
        std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x12e41e);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff830,in_stack_fffffffffffff828,
                   (allocator_type *)in_stack_fffffffffffff820);
        std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x12e44a);
        local_350 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_340);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff810,
                   CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff810,
                   CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_220);
        anon_unknown.dwarf_1537e::CompressZip
                  ((uchar *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
                   in_stack_fffffffffffff8c8,(uchar *)in_stack_fffffffffffff8c0,
                   (unsigned_long)in_stack_fffffffffffff8b8._M_current);
        std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x12e4e1);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff830,in_stack_fffffffffffff828,
                   (allocator_type *)in_stack_fffffffffffff820);
        std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x12e50a);
        local_370 = (undefined4)local_350;
        piVar4 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   in_stack_fffffffffffff810,
                                   CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        *piVar4 = local_1fc;
        pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            in_stack_fffffffffffff810,
                            CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        *(undefined4 *)pvVar6 = local_370;
        bVar2 = anon_unknown.dwarf_1537e::IsBigEndian();
        if (bVar2) {
          puVar7 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      in_stack_fffffffffffff810,
                                      CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808))
          ;
          anon_unknown.dwarf_1537e::swap4(puVar7);
          puVar7 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      in_stack_fffffffffffff810,
                                      CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808))
          ;
          anon_unknown.dwarf_1537e::swap4(puVar7);
        }
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](&local_1c0,(long)local_1f8);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](&local_1c0,(long)local_1f8);
        local_380 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808
                                                ));
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffff810,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        local_388 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808
                                                ));
        local_390 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808
                                                ));
        __first_01._M_current._7_1_ = in_stack_fffffffffffff867;
        __first_01._M_current._0_7_ = in_stack_fffffffffffff860;
        local_398 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                             insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        in_stack_fffffffffffff850,in_stack_fffffffffffff868,
                                        __first_01,in_stack_fffffffffffff858);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](&local_1c0,(long)local_1f8);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](&local_1c0,(long)local_1f8);
        local_3a8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808
                                                ));
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffff810,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        local_3b0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808
                                                ));
        local_3c0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808
                                                ));
        local_3b8 = (uchar *)__gnu_cxx::
                             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                          *)in_stack_fffffffffffff818,
                                         (difference_type)in_stack_fffffffffffff810);
        __first_02._M_current._7_1_ = in_stack_fffffffffffff867;
        __first_02._M_current._0_7_ = in_stack_fffffffffffff860;
        local_3c8 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                             insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        in_stack_fffffffffffff850,in_stack_fffffffffffff868,
                                        __first_02,in_stack_fffffffffffff858);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff820);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff820);
      }
      else if (*(int *)(local_10 + 0x1034) == 4) {
        sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_220);
        local_3cc = (undefined4)(long)((double)(sVar5 & 0xffffffff) * 1.2 + 1024.0);
        std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x12e8d4);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff830,in_stack_fffffffffffff828,
                   (allocator_type *)in_stack_fffffffffffff820);
        std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x12e900);
        sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_3e8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff810,
                   CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff810,
                   CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_220);
        in_stack_fffffffffffff808 = local_208;
        anon_unknown.dwarf_1537e::CompressPiz
                  (in_stack_00021988,in_stack_00021980,in_stack_00021978,in_stack_00021970,
                   in_stack_00021968,in_stack_00021964,in_stack_000219a0);
        std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x12e9b9);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff830,in_stack_fffffffffffff828,
                   (allocator_type *)in_stack_fffffffffffff820);
        std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x12e9e2);
        piVar4 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   in_stack_fffffffffffff810,
                                   CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        *piVar4 = local_1fc;
        pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            in_stack_fffffffffffff810,
                            CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        *(int *)pvVar6 = (int)sVar5;
        in_stack_fffffffffffff8d7 = anon_unknown.dwarf_1537e::IsBigEndian();
        if ((bool)in_stack_fffffffffffff8d7) {
          in_stack_fffffffffffff8c8 =
               (unsigned_long_long *)
               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          in_stack_fffffffffffff810,
                          CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
          anon_unknown.dwarf_1537e::swap4((uint *)in_stack_fffffffffffff8c8);
          in_stack_fffffffffffff8c0 =
               (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  in_stack_fffffffffffff810,
                                  CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
          anon_unknown.dwarf_1537e::swap4(in_stack_fffffffffffff8c0);
        }
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](&local_1c0,(long)local_1f8);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](&local_1c0,(long)local_1f8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffff810,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        __first_03._M_current._7_1_ = in_stack_fffffffffffff867;
        __first_03._M_current._0_7_ = in_stack_fffffffffffff860;
        in_stack_fffffffffffff8b8 =
             std::vector<unsigned_char,std::allocator<unsigned_char>>::
             insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        in_stack_fffffffffffff850,in_stack_fffffffffffff868,__first_03,
                        in_stack_fffffffffffff858);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](&local_1c0,(long)local_1f8);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](&local_1c0,(long)local_1f8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffff810,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        __gnu_cxx::
        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)in_stack_fffffffffffff818,(difference_type)in_stack_fffffffffffff810);
        __first_04._M_current._7_1_ = in_stack_fffffffffffff867;
        __first_04._M_current._0_7_ = in_stack_fffffffffffff860;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff850,in_stack_fffffffffffff868,__first_04,
                   in_stack_fffffffffffff858);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff820);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff820);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff820)
      ;
    }
    for (local_46c = 0; local_46c < local_158; local_46c = local_46c + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffff810,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
      in_stack_fffffffffffff868._M_current = (uchar *)&local_1c0;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_fffffffffffff868._M_current,(long)local_46c);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_fffffffffffff868._M_current,(long)local_46c);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
      __first_05._M_current._7_1_ = in_stack_fffffffffffff867;
      __first_05._M_current._0_7_ = in_stack_fffffffffffff860;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff850,
                 in_stack_fffffffffffff868,__first_05,in_stack_fffffffffffff858);
      in_stack_fffffffffffff858._M_current = (uchar *)local_188;
      pvVar8 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                         (&local_170,(long)local_46c);
      *pvVar8 = (value_type)in_stack_fffffffffffff858._M_current;
      in_stack_fffffffffffff867 = anon_unknown.dwarf_1537e::IsBigEndian();
      if ((bool)in_stack_fffffffffffff867) {
        val_00 = (unsigned_long_long *)
                 std::vector<long_long,_std::allocator<long_long>_>::operator[]
                           (&local_170,(long)local_46c);
        anon_unknown.dwarf_1537e::swap8(val_00);
      }
      this = std::
             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator[](&local_1c0,(long)local_46c);
      sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this);
      local_188 = (vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                   *)((long)&(local_188->
                             super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                             )._M_impl.super__Vector_impl_data._M_start + sVar5);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffff810,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    pvVar9 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             std::vector<long_long,_std::allocator<long_long>_>::at
                       (in_stack_fffffffffffff810,
                        CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    pvVar8 = std::vector<long_long,_std::allocator<long_long>_>::at
                       (in_stack_fffffffffffff810,
                        CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              (pvVar9,(const_iterator)in_stack_fffffffffffff858._M_current,(uchar *)pvVar8,
               (uchar *)in_stack_fffffffffffff840);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffff810,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    __first_06._M_current._7_1_ = in_stack_fffffffffffff867;
    __first_06._M_current._0_7_ = in_stack_fffffffffffff860;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (pvVar9,in_stack_fffffffffffff868,__first_06,in_stack_fffffffffffff858);
    pvVar9 = &local_38;
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar9);
    pvVar10 = malloc(sVar5);
    *local_18 = pvVar10;
    pvVar10 = (void *)*local_18;
    this_00 = (vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
               *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                           (pvVar9,CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_38);
    memcpy(pvVar10,this_00,sVar5);
    local_8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_38);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
    std::vector<long_long,_std::allocator<long_long>_>::~vector
              ((vector<long_long,_std::allocator<long_long>_> *)this_00);
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::~vector(this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  }
  return local_8;
}

Assistant:

size_t SaveMultiChannelEXRToMemory(const EXRImage *exrImage,
                                   unsigned char **memory_out,
                                   const char **err) {
  if (exrImage == NULL || memory_out == NULL || exrImage->compression < 0 ||
      exrImage->compression > TINYEXR_COMPRESSIONTYPE_PIZ) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return 0;
  }

  std::vector<unsigned char> memory;

  // Header
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};
    memory.insert(memory.end(), header, header + 4);
  }

  // Version, scanline.
  {
    const char marker[] = {2, 0, 0, 0};
    memory.insert(memory.end(), marker, marker + 4);
  }

  int numScanlines = 1;
  if (exrImage->compression == TINYEXR_COMPRESSIONTYPE_ZIP) {
    numScanlines = 16;
  } else if (exrImage->compression == TINYEXR_COMPRESSIONTYPE_PIZ) {
    numScanlines = 32;
  }

  // Write attributes.
  std::vector<ChannelInfo> channels;
  {
    std::vector<unsigned char> data;

    for (int c = 0; c < exrImage->num_channels; c++) {
      ChannelInfo info;
      info.pLinear = 0;
      info.pixelType = exrImage->requested_pixel_types[c];
      info.xSampling = 1;
      info.ySampling = 1;
      info.name = std::string(exrImage->channel_names[c]);
      channels.push_back(info);
    }

    WriteChannelInfo(data, channels);

    WriteAttributeToMemory(memory, "channels", "chlist", &data.at(0),
                           data.size()); // +1 = null
  }

  {
    int comp = exrImage->compression;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&comp));
    }
    WriteAttributeToMemory(memory, "compression", "compression",
                           reinterpret_cast<const unsigned char *>(&comp), 1);
  }

  {
    int data[4] = {0, 0, exrImage->width - 1, exrImage->height - 1};
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&data[0]));
      swap4(reinterpret_cast<unsigned int *>(&data[1]));
      swap4(reinterpret_cast<unsigned int *>(&data[2]));
      swap4(reinterpret_cast<unsigned int *>(&data[3]));
    }
    WriteAttributeToMemory(memory, "dataWindow", "box2i",
                           reinterpret_cast<const unsigned char *>(data),
                           sizeof(int) * 4);
    WriteAttributeToMemory(memory, "displayWindow", "box2i",
                           reinterpret_cast<const unsigned char *>(data),
                           sizeof(int) * 4);
  }

  {
    unsigned char lineOrder = 0; // increasingY
    WriteAttributeToMemory(memory, "lineOrder", "lineOrder", &lineOrder, 1);
  }

  {
    float aspectRatio = 1.0f;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&aspectRatio));
    }
    WriteAttributeToMemory(
        memory, "pixelAspectRatio", "float",
        reinterpret_cast<const unsigned char *>(&aspectRatio), sizeof(float));
  }

  {
    float center[2] = {0.0f, 0.0f};
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&center[0]));
      swap4(reinterpret_cast<unsigned int *>(&center[1]));
    }
    WriteAttributeToMemory(memory, "screenWindowCenter", "v2f",
                           reinterpret_cast<const unsigned char *>(center),
                           2 * sizeof(float));
  }

  {
    float w = (float)exrImage->width;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&w));
    }
    WriteAttributeToMemory(memory, "screenWindowWidth", "float",
                           reinterpret_cast<const unsigned char *>(&w),
                           sizeof(float));
  }

  // Custom attributes
  if (exrImage->num_custom_attributes > 0) {
    // @todo { endian }
    for (int i = 0; i < exrImage->num_custom_attributes; i++) {
      WriteAttributeToMemory(memory, exrImage->custom_attributes[i].name,
                             exrImage->custom_attributes[i].type,
                             reinterpret_cast<const unsigned char *>(
                                 &exrImage->custom_attributes[i].value),
                             exrImage->custom_attributes[i].size);
    }
  }

  { // end of header
    unsigned char e = 0;
    memory.push_back(e);
  }

  int numBlocks = exrImage->height / numScanlines;
  if (numBlocks * numScanlines < exrImage->height) {
    numBlocks++;
  }

  std::vector<long long> offsets(numBlocks);

  size_t headerSize = memory.size();
  long long offset =
      headerSize +
      numBlocks * sizeof(long long); // sizeof(header) + sizeof(offsetTable)

  std::vector<unsigned char> data;

  bool isBigEndian = IsBigEndian();

  std::vector<std::vector<unsigned char> > dataList(numBlocks);
  std::vector<size_t> channelOffsetList(exrImage->num_channels);

  int pixelDataSize = 0;
  size_t channelOffset = 0;
  for (int c = 0; c < exrImage->num_channels; c++) {
    channelOffsetList[c] = channelOffset;
    if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
      pixelDataSize += sizeof(unsigned short);
      channelOffset += sizeof(unsigned short);
    } else if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
      pixelDataSize += sizeof(float);
      channelOffset += sizeof(float);
    } else if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT) {
      pixelDataSize += sizeof(unsigned int);
      channelOffset += sizeof(unsigned int);
    } else {
      assert(0);
    }
  }

#ifdef _OPENMP
#pragma omp parallel for
#endif
  for (int i = 0; i < numBlocks; i++) {
    int startY = numScanlines * i;
    int endY = (std::min)(numScanlines * (i + 1), exrImage->height);
    int h = endY - startY;

    std::vector<unsigned char> buf(exrImage->width * h * pixelDataSize);

    for (int c = 0; c < exrImage->num_channels; c++) {
      if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {

        if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              FP16 h16;
              h16.u = reinterpret_cast<unsigned short **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              FP32 f32 = half_to_float(h16);

              if (isBigEndian) {
                swap4(reinterpret_cast<unsigned int *>(&f32.f));
              }

              // Assume increasing Y
              float *linePtr = reinterpret_cast<float *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = f32.f;
            }
          }
        } else if (exrImage->requested_pixel_types[c] ==
                   TINYEXR_PIXELTYPE_HALF) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              unsigned short val = reinterpret_cast<unsigned short **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              if (isBigEndian) {
                swap2(&val);
              }

              // Assume increasing Y
              unsigned short *linePtr = reinterpret_cast<unsigned short *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = val;
            }
          }
        } else {
          assert(0);
        }

      } else if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {

        if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              FP32 f32;
              f32.f = reinterpret_cast<float **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              FP16 h16;
              h16 = float_to_half_full(f32);

              if (isBigEndian) {
                swap2(reinterpret_cast<unsigned short *>(&h16.u));
              }

              // Assume increasing Y
              unsigned short *linePtr = reinterpret_cast<unsigned short *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = h16.u;
            }
          }
        } else if (exrImage->requested_pixel_types[c] ==
                   TINYEXR_PIXELTYPE_FLOAT) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              float val = reinterpret_cast<float **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              if (isBigEndian) {
                swap4(reinterpret_cast<unsigned int *>(&val));
              }

              // Assume increasing Y
              float *linePtr = reinterpret_cast<float *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = val;
            }
          }
        } else {
          assert(0);
        }
      } else if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_UINT) {

        for (int y = 0; y < h; y++) {
          for (int x = 0; x < exrImage->width; x++) {
            unsigned int val = reinterpret_cast<unsigned int **>(
                exrImage->images)[c][(y + startY) * exrImage->width + x];

            if (isBigEndian) {
              swap4(&val);
            }

            // Assume increasing Y
            unsigned int *linePtr = reinterpret_cast<unsigned int *>(
                &buf.at(pixelDataSize * y * exrImage->width +
                        channelOffsetList[c] * exrImage->width));
            linePtr[x] = val;
          }
        }
      }
    }

    if (exrImage->compression == TINYEXR_COMPRESSIONTYPE_NONE) {

      // 4 byte: scan line
      // 4 byte: data size
      // ~     : pixel data(uncompressed)
      std::vector<unsigned char> header(8);
      unsigned int dataLen = (unsigned int)buf.size();
      memcpy(&header.at(0), &startY, sizeof(int));
      memcpy(&header.at(4), &dataLen, sizeof(unsigned int));

      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&header.at(0)));
        swap4(reinterpret_cast<unsigned int *>(&header.at(4)));
      }

      dataList[i].insert(dataList[i].end(), header.begin(), header.end());
      dataList[i].insert(dataList[i].end(), buf.begin(), buf.begin() + dataLen);

    } else if ((exrImage->compression == TINYEXR_COMPRESSIONTYPE_ZIPS) ||
               (exrImage->compression == TINYEXR_COMPRESSIONTYPE_ZIP)) {

      std::vector<unsigned char> block(miniz::mz_compressBound(buf.size()));
      unsigned long long outSize = block.size();

      CompressZip(&block.at(0), outSize,
                  reinterpret_cast<const unsigned char *>(&buf.at(0)),
                  buf.size());

      // 4 byte: scan line
      // 4 byte: data size
      // ~     : pixel data(compressed)
      std::vector<unsigned char> header(8);
      unsigned int dataLen = outSize; // truncate
      memcpy(&header.at(0), &startY, sizeof(int));
      memcpy(&header.at(4), &dataLen, sizeof(unsigned int));

      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&header.at(0)));
        swap4(reinterpret_cast<unsigned int *>(&header.at(4)));
      }

      dataList[i].insert(dataList[i].end(), header.begin(), header.end());
      dataList[i].insert(dataList[i].end(), block.begin(),
                         block.begin() + dataLen);

    } else if (exrImage->compression == TINYEXR_COMPRESSIONTYPE_PIZ) {
      unsigned int bufLen =
          1024 +
          1.2 * (unsigned int)buf.size(); // @fixme { compute good bound. }
      std::vector<unsigned char> block(bufLen);
      unsigned int outSize = static_cast<unsigned int>(block.size());

      CompressPiz(&block.at(0), outSize,
                  reinterpret_cast<const unsigned char *>(&buf.at(0)),
                  buf.size(), channels, exrImage->width, h);

      // 4 byte: scan line
      // 4 byte: data size
      // ~     : pixel data(compressed)
      std::vector<unsigned char> header(8);
      unsigned int dataLen = outSize;
      memcpy(&header.at(0), &startY, sizeof(int));
      memcpy(&header.at(4), &dataLen, sizeof(unsigned int));

      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&header.at(0)));
        swap4(reinterpret_cast<unsigned int *>(&header.at(4)));
      }

      dataList[i].insert(dataList[i].end(), header.begin(), header.end());
      dataList[i].insert(dataList[i].end(), block.begin(),
                         block.begin() + dataLen);

    } else {
      assert(0);
    }

  } // omp parallel

  for (int i = 0; i < numBlocks; i++) {

    data.insert(data.end(), dataList[i].begin(), dataList[i].end());

    offsets[i] = offset;
    if (IsBigEndian()) {
      swap8(reinterpret_cast<unsigned long long *>(&offsets[i]));
    }
    offset += dataList[i].size();
  }

  {
    memory.insert(memory.end(),
                  reinterpret_cast<unsigned char *>(&offsets.at(0)),
                  reinterpret_cast<unsigned char *>(&offsets.at(0)) +
                      sizeof(unsigned long long) * numBlocks);
  }

  { memory.insert(memory.end(), data.begin(), data.end()); }

  assert(memory.size() > 0);

  (*memory_out) = (unsigned char *)malloc(memory.size());
  memcpy((*memory_out), &memory.at(0), memory.size());

  return memory.size(); // OK
}